

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_tlbwe_40x(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_ptr pTVar2;
  uint32_t error;
  uint32_t excp;
  code *func;
  TCGTemp *local_18;
  long local_10;
  long local_8;
  
  if (ctx->pr == true) {
    excp = 6;
    error = 0x31;
LAB_00b8c7c1:
    gen_exception_err(ctx,excp,error);
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  if ((short)((uVar1 & 0xffff) >> 0xb) == 1) {
    pTVar2 = tcg_ctx->cpu_env;
    local_10 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
    local_8 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
    func = helper_4xx_tlbwe_lo_ppc64;
  }
  else {
    if ((uVar1 & 0xffff) >> 0xb != 0) {
      excp = 0x60;
      error = 0x21;
      goto LAB_00b8c7c1;
    }
    pTVar2 = tcg_ctx->cpu_env;
    local_10 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
    local_8 = *(long *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
    func = helper_4xx_tlbwe_hi_ppc64;
  }
  local_8 = (long)&tcg_ctx->pool_cur + local_8;
  local_10 = (long)&tcg_ctx->pool_cur + local_10;
  local_18 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  tcg_gen_callN_ppc64(tcg_ctx,func,(TCGTemp *)0x0,3,&local_18);
  return;
}

Assistant:

static void gen_tlbwe_40x(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;

    switch (rB(ctx->opcode)) {
    case 0:
        gen_helper_4xx_tlbwe_hi(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)],
                                cpu_gpr[rS(ctx->opcode)]);
        break;
    case 1:
        gen_helper_4xx_tlbwe_lo(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rA(ctx->opcode)],
                                cpu_gpr[rS(ctx->opcode)]);
        break;
    default:
        gen_inval_exception(ctx, POWERPC_EXCP_INVAL_INVAL);
        break;
    }
}